

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O1

void __thiscall Samba::readXmodem(Samba *this,uint8_t *buffer,int size)

{
  SerialPort *pSVar1;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  size_t __n;
  int iVar6;
  ushort uVar7;
  int iVar9;
  uint8_t blk [133];
  char local_b8;
  char local_b7;
  byte local_b5 [128];
  undefined1 local_35;
  undefined1 local_34;
  ulong uVar8;
  
  if (0 < size) {
    iVar6 = 1;
    do {
      iVar9 = 0;
      do {
        if (iVar6 == 1) {
          pSVar1 = (this->_port)._M_t.
                   super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                   super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                   super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
          (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x43);
        }
        pSVar1 = (this->_port)._M_t.
                 super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                 super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                 super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
        iVar3 = (*pSVar1->_vptr_SerialPort[5])(pSVar1,&local_b8,0x85);
        if (((iVar3 == 0x85) && (local_b8 == '\x01')) && (local_b7 == (char)iVar6)) {
          lVar5 = 0;
          uVar8 = 0;
          do {
            uVar7 = (ushort)((int)uVar8 << 8) ^
                    crc16Table[(uint)local_b5[lVar5] ^ (uint)(uVar8 >> 8)];
            uVar8 = (ulong)uVar7;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x80);
          if (CONCAT11(local_35,local_34) == uVar7) goto LAB_0010c102;
        }
        if (iVar6 != 1) {
          pSVar1 = (this->_port)._M_t.
                   super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                   super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                   super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
          (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x15);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 != 5);
      iVar9 = 5;
LAB_0010c102:
      if (iVar9 == 5) goto LAB_0010c17f;
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[8])(pSVar1,6);
      __n = 0x80;
      if (size < 0x80) {
        __n = (size_t)(uint)size;
      }
      memcpy(buffer,local_b5,__n);
      buffer = buffer + 0x80;
      iVar6 = iVar6 + 1;
      bVar2 = 0x80 < size;
      size = size - 0x80;
    } while (bVar2);
  }
  iVar6 = 5;
  do {
    iVar9 = (*((this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    if (iVar9 == 4) {
      (*pSVar1->_vptr_SerialPort[8])(pSVar1,6);
      if (iVar6 != 0) {
        return;
      }
      break;
    }
    (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x15);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
LAB_0010c17f:
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_001195a0;
  __cxa_throw(puVar4,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

void
Samba::readXmodem(uint8_t* buffer, int size)
{
    uint8_t blk[BLK_SIZE + 5];
    uint32_t blkNum = 1;
    int retries;
    int bytes;

    while (size > 0)
    {
        for (retries = 0; retries < MAX_RETRIES; retries++)
        {
            if (blkNum == 1)
                _port->put(START);

            bytes = _port->read(blk, sizeof(blk));
            if (bytes == sizeof(blk) &&
                blk[0] == SOH &&
                blk[1] == (blkNum & 0xff) &&
                crc16Check(blk))
                break;

            if (blkNum != 1)
                _port->put(NAK);
        }
        if (retries == MAX_RETRIES)
            throw SambaError();

        _port->put(ACK);

        memmove(buffer, &blk[3], min(size, BLK_SIZE));
        buffer += BLK_SIZE;
        size -= BLK_SIZE;
        blkNum++;
    }

    for (retries = 0; retries < MAX_RETRIES; retries++)
    {
        if (_port->get() == EOT)
        {
            _port->put(ACK);
            break;
        }
        _port->put(NAK);
    }
    if (retries == MAX_RETRIES)
        throw SambaError();
}